

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_api_loader.cpp
# Opt level: O0

int lua_upvalueindex(int i)

{
  undefined4 local_c;
  int i_local;
  
  if (luaVersion == LUA_54) {
    local_c = -0xf4628 - i;
  }
  else if (luaVersion == LUA_53) {
    local_c = -0xf4628 - i;
  }
  else if (luaVersion == LUA_52) {
    local_c = -0xf4628 - i;
  }
  else {
    local_c = -0x2712 - i;
  }
  return local_c;
}

Assistant:

int lua_upvalueindex(int i)
{
	if (luaVersion == LuaVersion::LUA_54)
		return -1001000 - i;
	if (luaVersion == LuaVersion::LUA_53)
		return -1001000 - i;
	if (luaVersion == LuaVersion::LUA_52)
		return -1001000 - i;
	return -10002 - i;
}